

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O2

Dec_Edge_t Dec_FactorLF_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  Vec_Int_t *vEdgeLits;
  Dec_Edge_t DVar1;
  Dec_Edge_t DVar2;
  int iVar3;
  void *pvVar4;
  Mvc_Cover_t *pDiv;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *local_40;
  Mvc_Cover_t *local_38;
  
  pvVar4 = Abc_FrameReadManDec();
  vEdgeLits = *(Vec_Int_t **)((long)pvVar4 + 0x10);
  pDiv = Mvc_CoverBestLiteralCover(pCover,pSimple);
  Mvc_CoverDivideByLiteral(pCover,pDiv,&local_38,&local_40);
  pCube = Mvc_CoverReadCubeHead(pDiv);
  DVar1 = Dec_FactorTrivialCube(pFForm,pDiv,pCube,vEdgeLits);
  Mvc_CoverFree(pDiv);
  DVar2 = Dec_Factor_rec(pFForm,local_38);
  Mvc_CoverFree(local_38);
  DVar1 = Dec_GraphAddNodeAnd(pFForm,DVar1,DVar2);
  iVar3 = Mvc_CoverReadCubeNum(local_40);
  if (iVar3 == 0) {
    Mvc_CoverFree(local_40);
  }
  else {
    DVar2 = Dec_Factor_rec(pFForm,local_40);
    Mvc_CoverFree(local_40);
    DVar1 = Dec_GraphAddNodeOr(pFForm,DVar1,DVar2);
  }
  return DVar1;
}

Assistant:

Dec_Edge_t Dec_FactorLF_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Dec_Man_t * pManDec = (Dec_Man_t *)Abc_FrameReadManDec();
    Vec_Int_t * vEdgeLits  = pManDec->vLits;
    Mvc_Cover_t * pDiv, * pQuo, * pRem;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd;

    // get the most often occurring literal
    pDiv = Mvc_CoverBestLiteralCover( pCover, pSimple );
    // divide the cover by the literal
    Mvc_CoverDivideByLiteral( pCover, pDiv, &pQuo, &pRem );
    // get the node pointer for the literal
    eNodeDiv = Dec_FactorTrivialCube( pFForm, pDiv, Mvc_CoverReadCubeHead(pDiv), vEdgeLits );
    Mvc_CoverFree( pDiv );
    // factor the quotient and remainder
    eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
    Mvc_CoverFree( pQuo );
    eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
    if ( Mvc_CoverReadCubeNum(pRem) == 0 )
    {
        Mvc_CoverFree( pRem );
        return eNodeAnd;
    }
    else
    {
        eNodeRem = Dec_Factor_rec( pFForm, pRem );
        Mvc_CoverFree( pRem );
        return Dec_GraphAddNodeOr( pFForm,  eNodeAnd, eNodeRem );
    }
}